

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_EXT_transform_feedback(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_EXT_transform_feedback != 0) {
    glad_glBeginTransformFeedbackEXT =
         (PFNGLBEGINTRANSFORMFEEDBACKEXTPROC)(*load)("glBeginTransformFeedbackEXT");
    glad_glEndTransformFeedbackEXT =
         (PFNGLENDTRANSFORMFEEDBACKEXTPROC)(*load)("glEndTransformFeedbackEXT");
    glad_glBindBufferRangeEXT = (PFNGLBINDBUFFERRANGEEXTPROC)(*load)("glBindBufferRangeEXT");
    glad_glBindBufferOffsetEXT = (PFNGLBINDBUFFEROFFSETEXTPROC)(*load)("glBindBufferOffsetEXT");
    glad_glBindBufferBaseEXT = (PFNGLBINDBUFFERBASEEXTPROC)(*load)("glBindBufferBaseEXT");
    glad_glTransformFeedbackVaryingsEXT =
         (PFNGLTRANSFORMFEEDBACKVARYINGSEXTPROC)(*load)("glTransformFeedbackVaryingsEXT");
    glad_glGetTransformFeedbackVaryingEXT =
         (PFNGLGETTRANSFORMFEEDBACKVARYINGEXTPROC)(*load)("glGetTransformFeedbackVaryingEXT");
  }
  return;
}

Assistant:

static void load_GL_EXT_transform_feedback(GLADloadproc load) {
	if(!GLAD_GL_EXT_transform_feedback) return;
	glad_glBeginTransformFeedbackEXT = (PFNGLBEGINTRANSFORMFEEDBACKEXTPROC)load("glBeginTransformFeedbackEXT");
	glad_glEndTransformFeedbackEXT = (PFNGLENDTRANSFORMFEEDBACKEXTPROC)load("glEndTransformFeedbackEXT");
	glad_glBindBufferRangeEXT = (PFNGLBINDBUFFERRANGEEXTPROC)load("glBindBufferRangeEXT");
	glad_glBindBufferOffsetEXT = (PFNGLBINDBUFFEROFFSETEXTPROC)load("glBindBufferOffsetEXT");
	glad_glBindBufferBaseEXT = (PFNGLBINDBUFFERBASEEXTPROC)load("glBindBufferBaseEXT");
	glad_glTransformFeedbackVaryingsEXT = (PFNGLTRANSFORMFEEDBACKVARYINGSEXTPROC)load("glTransformFeedbackVaryingsEXT");
	glad_glGetTransformFeedbackVaryingEXT = (PFNGLGETTRANSFORMFEEDBACKVARYINGEXTPROC)load("glGetTransformFeedbackVaryingEXT");
}